

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O1

void do_func(int *ip)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (pass != 1) {
    if (lablptr == (t_symbol *)0x0) {
      error("No name for this function!");
      return;
    }
    if (lablptr->refcnt == 0) {
      func_install(*ip);
      return;
    }
    if (lablptr->type != 6) {
      if (lablptr->type != 5) {
        fatal_error("Symbol already used by a label!");
        return;
      }
      fatal_error("Symbol already used by a macro!");
    }
    fatal_error("Function already defined!");
    return;
  }
  if (list_level == 0) {
    return;
  }
  if (xlist == 0) {
    return;
  }
  if (asm_opt[0] == 0) {
    return;
  }
  if ((expand_macro != 0) && (asm_opt[1] == 0)) {
    return;
  }
  if (continued_line != 0) {
    strcpy(prlnbuf,tmplnbuf);
  }
  if (data_loccnt != -1) {
    loadlc(data_loccnt,0);
    iVar5 = loccnt - data_loccnt;
    if (data_level <= list_level || iVar5 < 4) {
      if (0 < iVar5) {
        iVar6 = 0;
        iVar7 = 0;
        do {
          if ((long)bank < 0xf0) {
            uVar2 = (uint)rom[bank][data_loccnt];
            lVar3 = 2;
            do {
              cVar1 = (char)(uVar2 & 0xf);
              cVar4 = cVar1 + '0';
              if (9 < (uVar2 & 0xf)) {
                cVar4 = cVar1 + 'A';
              }
              prlnbuf[lVar3 + (long)iVar7 * 3 + 0xf] = cVar4;
              uVar2 = uVar2 >> 4;
              lVar3 = lVar3 + -1;
            } while (lVar3 != 0);
          }
          else {
            (prlnbuf + (long)iVar7 * 3 + 0x10)[0] = '-';
            (prlnbuf + (long)iVar7 * 3 + 0x10)[1] = '-';
          }
          data_loccnt = data_loccnt + 1;
          iVar7 = iVar7 + 1;
          if (iVar7 == data_size) {
            iVar7 = 0;
            fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
            builtin_strncpy(prlnbuf,"                          ",0x1a);
            prlnbuf[0x1b] = '\0';
            loadlc(data_loccnt,0);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar5);
        if (iVar7 != 0) goto LAB_0010fa24;
      }
      return;
    }
  }
LAB_0010fa24:
  fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
  return;
}

Assistant:

void
do_func(int *ip)
{
	if (pass == LAST_PASS)
		println();
	else {
		/* error checking */
		if (lablptr == NULL) {
			error("No name for this function!");
			return;
		}
		if (lablptr->refcnt) {
			switch (lablptr->type) {
			case MACRO:
				fatal_error("Symbol already used by a macro!");

			case FUNC:
				fatal_error("Function already defined!");
				return;

			default:
				fatal_error("Symbol already used by a label!");
				return;
			}
		}

		/* install this new function in the hash table */
		if (!func_install(*ip))
			return;
	} 
}